

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::health(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Sys *this,Url *leader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Client *client;
  string local_60;
  Url local_40;
  
  client = this->client_;
  Vault::operator+(&local_60,leader,"/v1/sys/health");
  paVar1 = &local_40.value_.field_2;
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar2) {
    local_40.value_.field_2._8_8_ = local_60.field_2._8_8_;
    local_40.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_40.value_._M_dataplus._M_p = local_60._M_dataplus._M_p;
  }
  local_40.value_.field_2._M_allocated_capacity._1_7_ = local_60.field_2._M_allocated_capacity._1_7_
  ;
  local_40.value_.field_2._M_local_buf[0] = local_60.field_2._M_local_buf[0];
  local_40.value_._M_string_length = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar2;
  HttpConsumer::get(__return_storage_ptr__,client,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.value_._M_dataplus._M_p,
                    local_40.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::health(const Url &leader) {
  return HttpConsumer::get(client_, Url{leader + "/v1/sys/health"});
}